

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_run_expired(multi_run_ctx *mrc)

{
  Curl_tree *pCVar1;
  curltime i;
  curltime now;
  CURLMcode local_2c;
  Curl_tree *pCStack_28;
  CURLMcode result;
  Curl_tree *t;
  Curl_easy *data;
  Curl_multi *multi;
  multi_run_ctx *mrc_local;
  
  data = (Curl_easy *)mrc->multi;
  t = (Curl_tree *)0x0;
  pCStack_28 = (Curl_tree *)0x0;
  local_2c = CURLM_OK;
  multi = (Curl_multi *)mrc;
  do {
    while( true ) {
      do {
        i._12_4_ = 0;
        i._0_12_ = *(undefined1 (*) [12])&multi->num_alive;
        pCVar1 = Curl_splaygetbest(i,*(Curl_tree **)&(data->req).httpversion_sent,
                                   &stack0xffffffffffffffd8);
        *(Curl_tree **)&(data->req).httpversion_sent = pCVar1;
        if (pCStack_28 == (Curl_tree *)0x0) {
          return local_2c;
        }
        t = (Curl_tree *)Curl_splayget(pCStack_28);
      } while ((Curl_easy *)t == (Curl_easy *)0x0);
      now._12_4_ = 0;
      now._0_12_ = *(undefined1 (*) [12])&multi->num_alive;
      add_next_timeout(now,(Curl_multi *)data,(Curl_easy *)t);
      if (t != (Curl_tree *)(data->msg).extmsg.data.whatever) break;
      *(undefined1 *)&(multi->dnscache).entries.table = 1;
    }
    (multi->msglist)._tail = (Curl_llist_node *)((long)&((multi->msglist)._tail)->_list + 1);
    sigpipe_apply((Curl_easy *)t,(sigpipe_ignore *)&(multi->msglist)._dtor);
    local_2c = multi_runsingle((Curl_multi *)data,(curltime *)&multi->num_alive,(Curl_easy *)t);
  } while ((CURLM_OK < local_2c) ||
          (local_2c = Curl_multi_ev_assess_xfer((Curl_multi *)data,(Curl_easy *)t),
          local_2c == CURLM_OK));
  return local_2c;
}

Assistant:

static CURLMcode multi_run_expired(struct multi_run_ctx *mrc)
{
  struct Curl_multi *multi = mrc->multi;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t = NULL;
  CURLMcode result = CURLM_OK;

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process (compared to mrc->now) in the splay and 'data' will be
   * re-assigned for every expired handle we deal with.
   */
  while(1) {
    /* Check if there is one (more) expired timer to deal with! This function
       extracts a matching node if there is one */
    multi->timetree = Curl_splaygetbest(mrc->now, multi->timetree, &t);
    if(!t)
      goto out;

    data = Curl_splayget(t); /* assign this for next loop */
    if(!data)
      continue;

    (void)add_next_timeout(mrc->now, multi, data);
    if(data == multi->admin) {
      mrc->run_cpool = TRUE;
      continue;
    }

    mrc->run_xfers++;
    sigpipe_apply(data, &mrc->pipe_st);
    result = multi_runsingle(multi, &mrc->now, data);

    if(CURLM_OK >= result) {
      /* reassess event handling of data */
      result = Curl_multi_ev_assess_xfer(multi, data);
      if(result)
        goto out;
    }
  }

out:
  return result;
}